

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O0

void __thiscall OpenMD::RestReader::readStuntDoubles(RestReader *this,istream *inputStream)

{
  bool bVar1;
  long lVar2;
  long *plVar3;
  char *in_RSI;
  long in_RDI;
  string line;
  string *in_stack_000003f8;
  RestReader *in_stack_00000400;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::istream::getline(in_RSI,in_RDI + 0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  lVar2 = std::__cxx11::string::find(&stack0xffffffffffffffd0,0x427deb);
  if (lVar2 == -1) {
    snprintf(painCave.errMsg,2000,"RestReader Error: Missing <StuntDoubles>\n");
    painCave.isFatal = 1;
    simError();
  }
  while( true ) {
    plVar3 = (long *)std::istream::getline(in_RSI,in_RDI + 0x68);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffd0,(char *)(in_RDI + 0x68));
    lVar2 = std::__cxx11::string::find(&stack0xffffffffffffffd0,0x427e24);
    if (lVar2 != -1) break;
    parseDumpLine(in_stack_00000400,in_stack_000003f8);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void RestReader::readStuntDoubles(std::istream& inputStream) {
    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<StuntDoubles>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: Missing <StuntDoubles>\n");
      painCave.isFatal = 1;
      simError();
    }

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</StuntDoubles>") != std::string::npos) { break; }

      parseDumpLine(line);
    }
  }